

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectricityBill.cpp
# Opt level: O1

void __thiscall
ElectricityBill::ElectricityBill(ElectricityBill *this,EventLoop *loop,string *text_root)

{
  size_t *this_00;
  pointer pcVar1;
  LogLevel LVar2;
  long lVar3;
  undefined1 local_4f0 [8];
  FileForRead file_read;
  long local_400 [30];
  undefined1 local_310 [8];
  Timer timer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 auStack_d8 [8];
  RoomInfo room_info;
  undefined1 local_90 [8];
  string flatname;
  string roomname;
  
  this->loop_ = loop;
  (this->text_root_)._M_dataplus._M_p = (pointer)&(this->text_root_).field_2;
  pcVar1 = (text_root->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->text_root_,pcVar1,pcVar1 + text_root->_M_string_length);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310,
                 &this->text_root_,&ROOM_MAP_FILE_abi_cxx11_);
  higan::FileForAppend::FileForAppend(&this->room_file_,(string *)local_310);
  if (local_310 != (undefined1  [8])&timer.name_._M_string_length) {
    operator_delete((void *)local_310,timer.name_._M_string_length + 1);
  }
  roomname.field_2._8_8_ = &this->room_informations_;
  (this->room_informations_).super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->room_informations_).super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->room_informations_).super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310,
                 text_root,&ROOM_MAP_FILE_abi_cxx11_);
  higan::FileForRead::FileForRead((FileForRead *)local_4f0,(string *)local_310);
  if (local_310 != (undefined1  [8])&timer.name_._M_string_length) {
    operator_delete((void *)local_310,timer.name_._M_string_length + 1);
  }
  local_90 = (undefined1  [8])&flatname._M_string_length;
  flatname._M_dataplus._M_p = (pointer)0x0;
  flatname._M_string_length._0_1_ = 0;
  flatname.field_2._8_8_ = &roomname._M_string_length;
  roomname._M_dataplus._M_p = (pointer)0x0;
  roomname._M_string_length._0_1_ = 0;
  while( true ) {
    higan::FileForRead::ReadLine_abi_cxx11_((string *)local_310,(FileForRead *)local_4f0);
    lVar3 = std::__cxx11::string::operator=((string *)local_90,(string *)local_310);
    lVar3 = *(long *)(lVar3 + 8);
    if (local_310 != (undefined1  [8])&timer.name_._M_string_length) {
      operator_delete((void *)local_310,timer.name_._M_string_length + 1);
    }
    if (lVar3 == 0) break;
    higan::FileForRead::ReadLine_abi_cxx11_((string *)local_310,(FileForRead *)local_4f0);
    std::__cxx11::string::operator=
              ((string *)(flatname.field_2._M_local_buf + 8),(string *)local_310);
    if (local_310 != (undefined1  [8])&timer.name_._M_string_length) {
      operator_delete((void *)local_310,timer.name_._M_string_length + 1);
    }
    RoomInfo::RoomInfo((RoomInfo *)auStack_d8,(string *)local_90,
                       (string *)((long)&flatname.field_2 + 8));
    std::vector<RoomInfo,_std::allocator<RoomInfo>_>::push_back
              ((vector<RoomInfo,_std::allocator<RoomInfo>_> *)roomname.field_2._8_8_,
               (RoomInfo *)auStack_d8);
    LVar2 = higan::Logger::GetLogLevel();
    if ((int)LVar2 < 2) {
      higan::Logger::Logger
                ((Logger *)local_310,INFO,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/example/ElectricityBill/ElectricityBill.cpp"
                 ,0x21,"ElectricityBill");
      std::operator+(&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_d8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&room_info.flatname.field_2 + 8));
      this_00 = &file_read.cache_buffer_.write_idx_;
      higan::Fmt::Fmt((Fmt *)this_00,"read room: %s from file",local_f8._M_dataplus._M_p);
      higan::Logger::operator<<((Logger *)local_310,(Fmt *)this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      higan::Logger::~Logger((Logger *)local_310);
    }
    if ((size_type *)room_info.flatname.field_2._8_8_ != &room_info.roomname._M_string_length) {
      operator_delete((void *)room_info.flatname.field_2._8_8_,
                      room_info.roomname._M_string_length + 1);
    }
    if (auStack_d8 != (undefined1  [8])&room_info.flatname._M_string_length) {
      operator_delete((void *)auStack_d8,room_info.flatname._M_string_length + 1);
    }
  }
  file_read.cache_buffer_.write_idx_ = (size_t)local_400;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&file_read.cache_buffer_.write_idx_,"QueryBill","");
  room_info.flatname._M_string_length = 0;
  room_info.flatname.field_2._M_allocated_capacity = 0;
  auStack_d8 = (undefined1  [8])0x0;
  room_info.flatname._M_dataplus._M_p = (pointer)0x0;
  auStack_d8 = (undefined1  [8])operator_new(0x18);
  *(code **)auStack_d8 = QueryBill;
  *(char *)((long)auStack_d8 + 8) = '\0';
  *(char *)((long)auStack_d8 + 9) = '\0';
  *(char *)((long)auStack_d8 + 10) = '\0';
  *(char *)((long)auStack_d8 + 0xb) = '\0';
  *(char *)((long)auStack_d8 + 0xc) = '\0';
  *(char *)((long)auStack_d8 + 0xd) = '\0';
  *(char *)((long)auStack_d8 + 0xe) = '\0';
  *(char *)((long)auStack_d8 + 0xf) = '\0';
  *(ElectricityBill **)((long)auStack_d8 + 0x10) = this;
  room_info.flatname.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<void_(const_higan::Timer_&),_std::_Bind<void_(ElectricityBill::*(ElectricityBill_*,_std::_Placeholder<1>))(const_higan::Timer_&)>_>
       ::_M_invoke;
  room_info.flatname._M_string_length =
       (size_type)
       std::
       _Function_handler<void_(const_higan::Timer_&),_std::_Bind<void_(ElectricityBill::*(ElectricityBill_*,_std::_Placeholder<1>))(const_higan::Timer_&)>_>
       ::_M_manager;
  higan::Timer::Timer((Timer *)local_310,(string *)&file_read.cache_buffer_.write_idx_,3600000,true,
                      (TimerCallback *)auStack_d8);
  if (room_info.flatname._M_string_length != 0) {
    (*(code *)room_info.flatname._M_string_length)(auStack_d8,auStack_d8,3);
  }
  if ((long *)file_read.cache_buffer_.write_idx_ != local_400) {
    operator_delete((void *)file_read.cache_buffer_.write_idx_,local_400[0] + 1);
  }
  higan::EventLoop::AddTimer(this->loop_,(Timer *)local_310);
  higan::Timer::~Timer((Timer *)local_310);
  if ((size_type *)flatname.field_2._8_8_ != &roomname._M_string_length) {
    operator_delete((void *)flatname.field_2._8_8_,
                    CONCAT71(roomname._M_string_length._1_7_,(undefined1)roomname._M_string_length)
                    + 1);
  }
  if (local_90 != (undefined1  [8])&flatname._M_string_length) {
    operator_delete((void *)local_90,
                    CONCAT71(flatname._M_string_length._1_7_,(undefined1)flatname._M_string_length)
                    + 1);
  }
  higan::FileForRead::~FileForRead((FileForRead *)local_4f0);
  return;
}

Assistant:

ElectricityBill::ElectricityBill(higan::EventLoop* loop, const std::string& text_root):
		loop_(loop),
		text_root_(text_root),
		room_file_(text_root_ + ROOM_MAP_FILE),
		room_informations_()
{
	higan::FileForRead file_read(text_root + ROOM_MAP_FILE);

	std::string flatname;
	std::string roomname;
	while (!(flatname = file_read.ReadLine()).empty())
	{
		roomname = file_read.ReadLine();

		RoomInfo room_info(flatname, roomname);
		room_informations_.push_back(room_info);

		LOG_INFO << higan::Fmt("read room: %s from file", room_info.GetRoomInfoString().c_str());
	}

	higan::Timer timer{"QueryBill", 60 * 60 * 1000, true,
					std::bind(&ElectricityBill::QueryBill, this, std::placeholders::_1)};
	loop_->AddTimer(timer);

}